

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-objdump.cc
# Opt level: O1

Result __thiscall
wabt::anon_unknown_16::BinaryReaderObjdump::PrintSymbolFlags
          (BinaryReaderObjdump *this,uint32_t flags)

{
  undefined *puVar1;
  Enum EVar2;
  char *pcVar3;
  
  if (flags < 0x100) {
    puVar1 = (&PTR_anon_var_dwarf_1c9fe_00153de0)[flags & 3];
    pcVar3 = "hidden";
    if ((flags & 4) == 0) {
      pcVar3 = "default";
    }
    if ((flags & 0x10) != 0) {
      PrintDetails(this," undefined");
    }
    if ((flags & 0x20) != 0) {
      PrintDetails(this," exported");
    }
    if ((flags & 0x40) != 0) {
      PrintDetails(this," explicit_name");
    }
    if (0x7f < flags) {
      PrintDetails(this," no_strip");
    }
    EVar2 = Ok;
    PrintDetails(this," binding=%s vis=%s\n",puVar1,pcVar3);
  }
  else {
    Stream::Writef(&((this->super_BinaryReaderObjdumpBase).err_stream_._M_t.
                     super___uniq_ptr_impl<wabt::FileStream,_std::default_delete<wabt::FileStream>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_wabt::FileStream_*,_std::default_delete<wabt::FileStream>_>
                     .super__Head_base<0UL,_wabt::FileStream_*,_false>._M_head_impl)->super_Stream,
                   "Unknown symbols flags: %x\n",flags);
    EVar2 = Error;
  }
  return (Result)EVar2;
}

Assistant:

Result BinaryReaderObjdump::PrintSymbolFlags(uint32_t flags) {
  if (flags > WABT_SYMBOL_FLAG_MAX) {
    err_stream_->Writef("Unknown symbols flags: %x\n", flags);
    return Result::Error;
  }

  const char* binding_name = nullptr;
  SymbolBinding binding =
      static_cast<SymbolBinding>(flags & WABT_SYMBOL_MASK_BINDING);
  switch (binding) {
    case SymbolBinding::Global:
      binding_name = "global";
      break;
    case SymbolBinding::Local:
      binding_name = "local";
      break;
    case SymbolBinding::Weak:
      binding_name = "weak";
      break;
  }

  const char* vis_name = nullptr;
  SymbolVisibility vis =
      static_cast<SymbolVisibility>(flags & WABT_SYMBOL_MASK_VISIBILITY);
  switch (vis) {
    case SymbolVisibility::Hidden:
      vis_name = "hidden";
      break;
    case SymbolVisibility::Default:
      vis_name = "default";
      break;
  }
  if (flags & WABT_SYMBOL_FLAG_UNDEFINED)
    PrintDetails(" undefined");
  if (flags & WABT_SYMBOL_FLAG_EXPORTED)
    PrintDetails(" exported");
  if (flags & WABT_SYMBOL_FLAG_EXPLICIT_NAME)
    PrintDetails(" explicit_name");
  if (flags & WABT_SYMBOL_FLAG_NO_STRIP)
    PrintDetails(" no_strip");

  PrintDetails(" binding=%s vis=%s\n", binding_name, vis_name);
  return Result::Ok;
}